

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

shared_ptr<wallet::CWallet> __thiscall
wallet::LoadWallet(wallet *this,WalletContext *context,string *name,optional<bool> load_on_start,
                  DatabaseOptions *options,DatabaseStatus *status,bilingual_str *error,
                  vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  Chain *pCVar1;
  string original;
  string original_00;
  string original_01;
  string original_02;
  string original_03;
  bilingual_str lhs;
  bilingual_str lhs_00;
  bilingual_str lhs_01;
  bilingual_str lhs_02;
  _Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  shared_ptr<wallet::CWallet> sVar4;
  shared_ptr<wallet::CWallet> wallet_1;
  undefined8 in_stack_fffffffffffffe18;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *pvVar5;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  long *plVar6;
  undefined8 uVar7;
  WalletStorage in_stack_fffffffffffffe48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe50;
  long *local_1a0;
  string local_198 [32];
  string local_178 [32];
  bilingual_str local_158;
  string local_118 [32];
  bilingual_str local_f8;
  bilingual_str local_b8;
  bilingual_str local_78;
  _Base_ptr local_38;
  
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)&local_78,(GlobalMutex *)g_loading_wallet_mutex,
             "g_loading_wallet_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0x174,false);
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)g_loading_wallet_set_abi_cxx11_,name);
  __position = pVar3.first._M_node;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_78);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_198,"Wallet already loading.",(allocator<char> *)&local_b8);
    original._M_string_length = (size_type)this;
    original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe18;
    original.field_2._M_allocated_capacity = (size_type)status;
    original.field_2._8_8_ = __position._M_node;
    Untranslated(&local_78,original);
    bilingual_str::operator=(error,&local_78);
    bilingual_str::~bilingual_str(&local_78);
    std::__cxx11::string::~string(local_198);
    *status = FAILED_LOAD;
    (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
    (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    MakeWalletDatabase((wallet *)&local_1a0,name,options,status,error);
    if (local_1a0 == (long *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_118,"Wallet file verification failed.",
                 (allocator<char> *)&stack0xfffffffffffffe48);
      original_00._M_string_length = (size_type)this;
      original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe18;
      original_00.field_2._M_allocated_capacity = (size_type)status;
      original_00.field_2._8_8_ = __position._M_node;
      Untranslated(&local_f8,original_00);
      std::__cxx11::string::string<std::allocator<char>>
                (local_178," ",(allocator<char> *)&stack0xfffffffffffffe40);
      original_01._M_string_length = (size_type)this;
      original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe18;
      original_01.field_2._M_allocated_capacity = (size_type)status;
      original_01.field_2._8_8_ = __position._M_node;
      Untranslated(&local_158,original_01);
      lhs.original._M_string_length = (size_type)this;
      lhs.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe18;
      lhs.original.field_2._M_allocated_capacity = (size_type)status;
      lhs.original.field_2._8_8_ = __position._M_node;
      lhs.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe38;
      lhs.translated._M_string_length = in_stack_fffffffffffffe40;
      lhs.translated.field_2._M_allocated_capacity =
           (size_type)in_stack_fffffffffffffe48._vptr_WalletStorage;
      lhs.translated.field_2._8_8_ = in_stack_fffffffffffffe50._M_pi;
      ::operator+(&local_b8,lhs,&local_f8);
      lhs_00.original._M_string_length = (size_type)this;
      lhs_00.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe18;
      lhs_00.original.field_2._M_allocated_capacity = (size_type)status;
      lhs_00.original.field_2._8_8_ = __position._M_node;
      lhs_00.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe38;
      lhs_00.translated._M_string_length = in_stack_fffffffffffffe40;
      lhs_00.translated.field_2._M_allocated_capacity =
           (size_type)in_stack_fffffffffffffe48._vptr_WalletStorage;
      lhs_00.translated.field_2._8_8_ = in_stack_fffffffffffffe50._M_pi;
      ::operator+(&local_78,lhs_00,&local_b8);
      bilingual_str::operator=(error,&local_78);
      bilingual_str::~bilingual_str(&local_78);
      bilingual_str::~bilingual_str(&local_b8);
      bilingual_str::~bilingual_str(&local_158);
      std::__cxx11::string::~string(local_178);
      bilingual_str::~bilingual_str(&local_f8);
      std::__cxx11::string::~string(local_118);
      (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
      (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
    }
    else {
      pCVar1 = context->chain;
      _(&local_78,(ConstevalStringLiteral)0xdf92e3);
      (*pCVar1->_vptr_Chain[0x25])(pCVar1,&local_78.translated);
      bilingual_str::~bilingual_str(&local_78);
      plVar6 = local_1a0;
      local_1a0 = (long *)0x0;
      pvVar5 = warnings;
      CWallet::Create((CWallet *)&stack0xfffffffffffffe48,context,name,
                      (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       )&stack0xfffffffffffffe40,options->create_flags,error,warnings);
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 8))();
      }
      uVar7 = 0;
      if ((CWallet *)in_stack_fffffffffffffe48._vptr_WalletStorage == (CWallet *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_118,"Wallet loading failed.",(allocator<char> *)&stack0xfffffffffffffe3f);
        original_02._M_string_length = (size_type)this;
        original_02._M_dataplus._M_p = (pointer)pvVar5;
        original_02.field_2._M_allocated_capacity = (size_type)status;
        original_02.field_2._8_8_ = __position._M_node;
        Untranslated(&local_f8,original_02);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_178," ",(allocator<char> *)&stack0xfffffffffffffe3e);
        original_03._M_string_length = (size_type)this;
        original_03._M_dataplus._M_p = (pointer)pvVar5;
        original_03.field_2._M_allocated_capacity = (size_type)status;
        original_03.field_2._8_8_ = __position._M_node;
        Untranslated(&local_158,original_03);
        lhs_01.original._M_string_length = (size_type)this;
        lhs_01.original._M_dataplus._M_p = (pointer)pvVar5;
        lhs_01.original.field_2._M_allocated_capacity = (size_type)status;
        lhs_01.original.field_2._8_8_ = __position._M_node;
        lhs_01.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe38;
        lhs_01.translated._M_string_length = uVar7;
        lhs_01.translated.field_2._M_allocated_capacity =
             (size_type)in_stack_fffffffffffffe48._vptr_WalletStorage;
        lhs_01.translated.field_2._8_8_ = in_stack_fffffffffffffe50._M_pi;
        ::operator+(&local_b8,lhs_01,&local_f8);
        lhs_02.original._M_string_length = (size_type)this;
        lhs_02.original._M_dataplus._M_p = (pointer)pvVar5;
        lhs_02.original.field_2._M_allocated_capacity = (size_type)status;
        lhs_02.original.field_2._8_8_ = __position._M_node;
        lhs_02.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe38;
        lhs_02.translated._M_string_length = uVar7;
        lhs_02.translated.field_2._M_allocated_capacity =
             (size_type)in_stack_fffffffffffffe48._vptr_WalletStorage;
        lhs_02.translated.field_2._8_8_ = in_stack_fffffffffffffe50._M_pi;
        ::operator+(&local_78,lhs_02,&local_b8);
        bilingual_str::operator=(error,&local_78);
        bilingual_str::~bilingual_str(&local_78);
        bilingual_str::~bilingual_str(&local_b8);
        bilingual_str::~bilingual_str(&local_158);
        std::__cxx11::string::~string(local_178);
        bilingual_str::~bilingual_str(&local_f8);
        std::__cxx11::string::~string(local_118);
        *status = FAILED_LOAD;
        (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
        (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
      }
      else {
        if (((((atomic<unsigned_long> *)(in_stack_fffffffffffffe48._vptr_WalletStorage + 0x16))->
             super___atomic_base<unsigned_long>)._M_i >> 0x22 & 1) == 0) {
          _(&local_78,(ConstevalStringLiteral)0xe08e9b);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (warnings,&local_78);
          bilingual_str::~bilingual_str(&local_78);
        }
        NotifyWalletLoaded(context,(shared_ptr<wallet::CWallet> *)&stack0xfffffffffffffe48);
        AddWallet(context,(shared_ptr<wallet::CWallet> *)&stack0xfffffffffffffe48);
        CWallet::postInitProcess((CWallet *)in_stack_fffffffffffffe48._vptr_WalletStorage);
        UpdateWalletSetting(context->chain,name,load_on_start,warnings);
        (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage =
             in_stack_fffffffffffffe48._vptr_WalletStorage;
        (((element_type *)this)->super_Notifications)._vptr_Notifications =
             (_func_int **)in_stack_fffffffffffffe50._M_pi;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffe50);
    }
    if (local_1a0 != (long *)0x0) {
      (**(code **)(*local_1a0 + 8))();
    }
    UniqueLock<GlobalMutex>::UniqueLock
              ((UniqueLock<GlobalMutex> *)&local_78,(GlobalMutex *)g_loading_wallet_mutex,
               "g_loading_wallet_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
               ,0x17b,false);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)g_loading_wallet_set_abi_cxx11_,(const_iterator)__position._M_node);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_78);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
    sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> LoadWallet(WalletContext& context, const std::string& name, std::optional<bool> load_on_start, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    auto result = WITH_LOCK(g_loading_wallet_mutex, return g_loading_wallet_set.insert(name));
    if (!result.second) {
        error = Untranslated("Wallet already loading.");
        status = DatabaseStatus::FAILED_LOAD;
        return nullptr;
    }
    auto wallet = LoadWalletInternal(context, name, load_on_start, options, status, error, warnings);
    WITH_LOCK(g_loading_wallet_mutex, g_loading_wallet_set.erase(result.first));
    return wallet;
}